

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int bbuf_clone(BBuf **rto,BBuf *from)

{
  bool bVar1;
  BBuf *bbuf;
  OnigUChar *pOVar2;
  int iVar3;
  uint uVar4;
  
  bbuf = (BBuf *)malloc(0x10);
  *rto = bbuf;
  if (bbuf == (BBuf *)0x0) {
    return -5;
  }
  uVar4 = from->alloc;
  if ((long)(int)uVar4 < 1) {
    bbuf->p = (OnigUChar *)0x0;
    uVar4 = 0;
  }
  else {
    pOVar2 = (OnigUChar *)malloc((long)(int)uVar4);
    bbuf->p = pOVar2;
    if (pOVar2 == (OnigUChar *)0x0) {
      iVar3 = -5;
      bVar1 = false;
      goto LAB_001100d7;
    }
  }
  bbuf->alloc = uVar4;
  bbuf->used = 0;
  iVar3 = 0;
  bVar1 = true;
LAB_001100d7:
  if (bVar1) {
    uVar4 = from->used;
    bbuf->used = uVar4;
    memcpy(bbuf->p,from->p,(ulong)uVar4);
    iVar3 = 0;
  }
  else {
    bbuf_free(bbuf);
    *rto = (BBuf *)0x0;
  }
  return iVar3;
}

Assistant:

static int
bbuf_clone(BBuf** rto, BBuf* from)
{
  int r;
  BBuf *to;

  *rto = to = (BBuf* )xmalloc(sizeof(BBuf));
  CHECK_NULL_RETURN_MEMERR(to);
  r = BB_INIT(to, from->alloc);
  if (r != 0) {
    bbuf_free(to);
    *rto = 0;
    return r;
  }
  to->used = from->used;
  xmemcpy(to->p, from->p, from->used);
  return 0;
}